

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

Node * __thiscall FBX::Decoder::readFile(Node *__return_storage_ptr__,Decoder *this)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  undefined1 __str [8];
  bool bVar1;
  size_type sVar2;
  invalid_argument *this_00;
  int local_104;
  undefined1 local_100 [8];
  Node node;
  vector<FBX::Node,_std::allocator<FBX::Node>_> nodes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  char *local_48;
  char *local_40;
  undefined1 local_38 [8];
  Span<char> temp;
  basic_string_view<char,_std::char_traits<char>_> FBX_HEADER;
  Decoder *this_local;
  Node *root;
  
  join_0x00000010_0x00000000_ = sv("Kaydara FBX Binary  ",0x17);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&temp.end);
  _local_38 = Stream::read<char>(&this->stream,sVar2);
  local_48 = temp.end;
  local_40 = (char *)FBX_HEADER._M_len;
  __str = local_38;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&temp.end);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_58,(char *)__str,sVar2);
  __x._M_str = local_40;
  __x._M_len = (size_t)local_48;
  bVar1 = std::operator!=(__x,local_58);
  if (!bVar1) {
    initVersion(this);
    std::vector<FBX::Node,_std::allocator<FBX::Node>_>::vector
              ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)
               &node.properties.
                super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    do {
      Node::Node((Node *)local_100);
      bVar1 = readNode(this,(Node *)local_100);
      if (bVar1) {
        std::vector<FBX::Node,_std::allocator<FBX::Node>_>::push_back
                  ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)
                   &node.properties.
                    super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_100);
        local_104 = 0;
      }
      else {
        local_104 = 3;
      }
      Node::~Node((Node *)local_100);
    } while (local_104 == 0);
    Node::Node(__return_storage_ptr__);
    std::vector<FBX::Node,_std::allocator<FBX::Node>_>::operator=
              (&__return_storage_ptr__->children,
               (vector<FBX::Node,_std::allocator<FBX::Node>_> *)
               &node.properties.
                super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector
              ((vector<FBX::Node,_std::allocator<FBX::Node>_> *)
               &node.properties.
                super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return __return_storage_ptr__;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_78,"Invalid header, file is not an FBX binary file ",&this->path);
  std::invalid_argument::invalid_argument(this_00,(string *)&local_78);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Node Decoder::readFile() {
        auto FBX_HEADER = "Kaydara FBX Binary  \x00\x1a\x00"sv;
        auto temp = stream.read<char>(FBX_HEADER.size());
        if (FBX_HEADER != std::string_view(temp.begin, FBX_HEADER.size()))
            throw std::invalid_argument("Invalid header, file is not an FBX binary file " + path);

        initVersion();

        std::vector<Node> nodes;
        while (true) {
            Node node;
            if (!readNode(node))
                break;
            nodes.push_back(node);
        }

        Node root;
        root.children = nodes;

        return root;
    }